

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

void set_ids(pcut_item_t *first)

{
  pcut_item_t *local_20;
  pcut_item_t *it;
  pcut_item_t *ppStack_10;
  int id;
  pcut_item_t *first_local;
  
  it._4_4_ = 1;
  if (first != (pcut_item_t *)0x0) {
    ppStack_10 = first;
    if (first->kind == 0) {
      ppStack_10 = pcut_get_real_next(first);
    }
    for (local_20 = ppStack_10; local_20 != (pcut_item_t *)0x0;
        local_20 = pcut_get_real_next(local_20)) {
      local_20->id = it._4_4_;
      it._4_4_ = it._4_4_ + 1;
    }
    return;
  }
  __assert_fail("first != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vhotspur[P]pcut/src/list.c",
                0x75,"void set_ids(pcut_item_t *)");
}

Assistant:

static void set_ids(pcut_item_t *first) {
	int id = 1;
	pcut_item_t *it;

	assert(first != NULL);

	if (first->kind == PCUT_KIND_SKIP) {
		first = pcut_get_real_next(first);
	}

	for (it = first; it != NULL; it = pcut_get_real_next(it)) {
		it->id = id;
		id++;
	}
}